

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_renderer.cpp
# Opt level: O2

unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>,_true> __thiscall
duckdb::TreeRenderer::CreateRenderer(TreeRenderer *this,ExplainFormat format)

{
  NotImplementedException *this_00;
  ulong uVar1;
  undefined7 in_register_00000031;
  allocator local_59;
  string local_58;
  string local_38;
  
  uVar1 = CONCAT71(in_register_00000031,format) & 0xffffffff;
  switch(uVar1) {
  case 0:
  case 1:
    make_uniq<duckdb::TextTreeRenderer>();
    break;
  case 2:
    make_uniq<duckdb::JSONTreeRenderer>();
    break;
  case 3:
    make_uniq<duckdb::HTMLTreeRenderer>();
    break;
  case 4:
    make_uniq<duckdb::GRAPHVIZTreeRenderer>();
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_58,"ExplainFormat %s not implemented",&local_59)
    ;
    EnumUtil::ToString<duckdb::ExplainFormat>(&local_38,(ExplainFormat)uVar1);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,&local_58,&local_38);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->_vptr_TreeRenderer = (_func_int **)local_58._M_dataplus._M_p;
  return (unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>_>)
         (unique_ptr<duckdb::TreeRenderer,_std::default_delete<duckdb::TreeRenderer>_>)this;
}

Assistant:

unique_ptr<TreeRenderer> TreeRenderer::CreateRenderer(ExplainFormat format) {
	switch (format) {
	case ExplainFormat::DEFAULT:
	case ExplainFormat::TEXT:
		return make_uniq<TextTreeRenderer>();
	case ExplainFormat::JSON:
		return make_uniq<JSONTreeRenderer>();
	case ExplainFormat::HTML:
		return make_uniq<HTMLTreeRenderer>();
	case ExplainFormat::GRAPHVIZ:
		return make_uniq<GRAPHVIZTreeRenderer>();
	default:
		throw NotImplementedException("ExplainFormat %s not implemented", EnumUtil::ToString(format));
	}
}